

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O2

bool woff2::WriteTableRecord(Table *table,size_t *offset,uint8_t *dst,size_t dst_size)

{
  size_t sVar1;
  Table *pTVar2;
  
  sVar1 = *offset;
  if (sVar1 + 0x10 <= dst_size) {
    pTVar2 = table->reuse_of;
    if (table->reuse_of == (Table *)0x0) {
      pTVar2 = table;
    }
    StoreU32(pTVar2->tag,offset,dst);
    StoreU32(pTVar2->checksum,offset,dst);
    StoreU32(pTVar2->offset,offset,dst);
    StoreU32(pTVar2->length,offset,dst);
  }
  return sVar1 + 0x10 <= dst_size;
}

Assistant:

bool WriteTableRecord(const Font::Table* table, size_t* offset, uint8_t* dst,
                      size_t dst_size) {
  if (dst_size < *offset + kSfntEntrySize) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (table->IsReused()) {
    table = table->reuse_of;
  }
  StoreU32(table->tag, offset, dst);
  StoreU32(table->checksum, offset, dst);
  StoreU32(table->offset, offset, dst);
  StoreU32(table->length, offset, dst);
  return true;
}